

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::FB::define_os(FB *this,FabArrayBase *fa)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_CommMetaData).m_threadsafe_loc = true;
  (this->super_CommMetaData).m_threadsafe_rcv = true;
  uVar2 = (ulong)((long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start) >> 2;
  uVar1 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar1;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    tag_one_box(this,(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar1],&fa->boxarray,&fa->distributionMap,true);
  }
  return;
}

Assistant:

void
FabArrayBase::FB::define_os (const FabArrayBase& fa)
{
    m_threadsafe_loc = true;
    m_threadsafe_rcv = true;

    const BoxArray&            ba       = fa.boxArray();
    const DistributionMapping& dm       = fa.DistributionMap();
    const Vector<int>&         imap     = fa.IndexArray();
    const int nlocal = imap.size();

    for (int i = 0; i < nlocal; ++i)
    {
        tag_one_box(imap[i], ba, dm, true);
    }

#ifdef AMREX_USE_MPI
    if (ParallelDescriptor::NProcs() > 1) {
        const std::vector<IntVect>& pshifts = m_period.shiftIntVect();
        std::vector< std::pair<int,Box> > isects;

        std::set<int> my_receiver;
        for (int i = 0; i < nlocal; ++i) {
            int const ksnd = imap[i];
            Box const& vbx = ba[ksnd];
            for (auto const& shft : pshifts) {
                ba.intersections(vbx+shft, isects, false, m_ngrow);
                for (auto const& is : isects) {
                    if (is.first != ksnd || shft != 0) {
                        my_receiver.insert(is.first);
                    }
                }
            }
        }

        // Unlike normal FillBoundary, we have to build the send tags
        // differently.  This is because (b1 \ b2) \ b3 might produce
        // different BoxList than (b1 \ b3) \ b2, not just in the order of
        // Boxes in BoxList that can be fixed by sorting.  To make sure the
        // send tags on the sender process matches the recv tags on the
        // receiver process, we make the sender to use the same procedure to
        // build tags as the receiver.

        for (auto const& krcv : my_receiver) {
            tag_one_box(krcv, ba, dm, false);
        }
    }
#endif

    // No need to sort send and recv tags because they are already sorted
    // due to the way they are built.
}